

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SocketStream::write(SocketStream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  size_t size_local;
  char *ptr_local;
  SocketStream *this_local;
  
  uVar1 = (*(this->super_Stream)._vptr_Stream[3])();
  if ((uVar1 & 1) == 0) {
    this_local = (SocketStream *)0xffffffffffffffff;
  }
  else {
    this_local = (SocketStream *)
                 send_socket(this->sock_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf,0
                            );
  }
  return (ssize_t)this_local;
}

Assistant:

inline ssize_t SocketStream::write(const char *ptr, size_t size) {
  if (!is_writable()) { return -1; }

#ifdef _WIN32
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#endif

  return send_socket(sock_, ptr, size, CPPHTTPLIB_SEND_FLAGS);
}